

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

bool __thiscall
QMainWindowLayoutState::restoreState
          (QMainWindowLayoutState *this,QDataStream *_stream,QMainWindowLayoutState *oldState)

{
  int iVar1;
  undefined1 auVar2 [8];
  QRect QVar3;
  Data *pDVar4;
  QDockAreaLayoutItem *pQVar5;
  qsizetype qVar6;
  char cVar7;
  bool bVar8;
  bool bVar9;
  QDockAreaLayout *this_00;
  QMainWindowLayout *this_01;
  QDockWidgetGroupWindow *this_02;
  QLayout *pQVar10;
  QDockAreaLayoutInfo *this_03;
  QWidget *pQVar11;
  QWidget **ppQVar12;
  QLayoutItem *this_04;
  long in_FS_OFFSET;
  QRect rect;
  uchar marker;
  byte local_174;
  QList<QDockWidget_*> local_148;
  byte local_129;
  QByteArray local_128;
  QArrayDataPointer<QDockAreaLayoutItem> local_108;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  QWidget **local_d8;
  _func_int **local_c8;
  QRect QStack_c0;
  QMainWindow *pQStack_b0;
  QArrayDataPointer<QDockAreaLayoutItem> local_a8;
  bool local_90;
  undefined7 uStack_8f;
  QTabBar *pQStack_88;
  Int local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_128.d.d = (Data *)0x0;
  local_128.d.ptr = (char *)0x0;
  local_128.d.size = 0;
  cVar7 = QDataStream::atEnd();
  if (cVar7 == '\0') {
    do {
      local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      auStack_e0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)local_e8,0x400,'\0');
      if ((local_e8 == (undefined1  [8])0x0) ||
         (1 < (((QArrayData *)local_e8)->ref_)._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)local_e8,(AllocationOption)local_d8);
      }
      QDataStream::readRawData((char *)_stream,(longlong)auStack_e0);
      QByteArray::resize((longlong)local_e8);
      QByteArray::append(&local_128);
      if (local_e8 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8,1,0x10);
        }
      }
      cVar7 = QDataStream::atEnd();
    } while (cVar7 == '\0');
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_128);
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,*(undefined4 *)(_stream + 0x18));
  bVar8 = checkFormat(this,(QDataStream *)&local_58);
  if (bVar8) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_78,&local_128);
    puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,*(undefined4 *)(_stream + 0x18));
    local_174 = QDataStream::atEnd();
    if (local_174 == 0) {
      this_00 = &this->dockAreaLayout;
      do {
        local_129 = 0xaa;
        QDataStream::operator>>((QDataStream *)&local_78,&local_129);
        switch(local_129) {
        case 0xf9:
          local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_148.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
          allMyDockWidgets(&local_148,&this->mainWindow->super_QWidget);
          this_01 = qt_mainwindow_layout(this->mainWindow);
          this_02 = QMainWindowLayout::createTabbedDockWindow((QMainWindowLayout *)this_01);
          QDockAreaLayoutInfo::QDockAreaLayoutInfo
                    ((QDockAreaLayoutInfo *)local_e8,&(this->dockAreaLayout).sep,LeftDock,Horizontal
                     ,1,this->mainWindow);
          pQVar10 = QWidget::layout(&this_02->super_QWidget);
          pQVar10[4].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)local_e8;
          QArrayDataPointer<QWidget_*>::operator=
                    ((QArrayDataPointer<QWidget_*> *)&pQVar10[4].super_QLayoutItem.align,
                     (QArrayDataPointer<QWidget_*> *)(local_e8 + 8));
          qVar6 = local_a8.size;
          pQVar5 = local_a8.ptr;
          pDVar4 = local_a8.d;
          *(undefined8 *)(pQVar10 + 6) = QStack_c0._8_8_;
          *(QMainWindow **)&pQVar10[6].field_0x8 = pQStack_b0;
          pQVar10[5].super_QLayoutItem._vptr_QLayoutItem = local_c8;
          pQVar10[5].super_QLayoutItem.align = (Alignment)QStack_c0.x1.m_i;
          *(int *)&pQVar10[5].super_QLayoutItem.field_0xc = QStack_c0.y1.m_i;
          local_a8.d = (Data *)0x0;
          local_a8.ptr = (QDockAreaLayoutItem *)0x0;
          local_a8.size = 0;
          local_108.d = (Data *)pQVar10[6].super_QLayoutItem._vptr_QLayoutItem;
          local_108.ptr = *(QDockAreaLayoutItem **)&pQVar10[6].super_QLayoutItem.align;
          pQVar10[6].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pDVar4;
          *(QDockAreaLayoutItem **)&pQVar10[6].super_QLayoutItem.align = pQVar5;
          local_108.size = *(qsizetype *)(pQVar10 + 7);
          *(qsizetype *)(pQVar10 + 7) = qVar6;
          QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_108);
          pQVar10[7].super_QLayoutItem.align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
          super_QFlagsStorage<Qt::AlignmentFlag>.i = local_80;
          pQVar10[7].field_0x8 = local_90;
          *(undefined7 *)&pQVar10[7].field_0x9 = uStack_8f;
          pQVar10[7].super_QLayoutItem._vptr_QLayoutItem = (_func_int **)pQStack_88;
          QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(&local_a8);
          if (auStack_e0 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)auStack_e0)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)auStack_e0)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)auStack_e0)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)auStack_e0,8,0x10);
            }
          }
          _local_e8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
          ::operator>>((QDataStream *)&local_78,(QRect *)local_e8);
          pQVar10 = QWidget::layout(&this_02->super_QWidget);
          this_04 = &pQVar10[4].super_QLayoutItem;
          pQVar11 = (QWidget *)0x0;
          bVar8 = QDockAreaLayoutInfo::restoreState
                            ((QDockAreaLayoutInfo *)this_04,(QDataStream *)&local_78,&local_148,
                             false);
          QVar3 = _local_e8;
          if (bVar8) {
            rect._8_8_ = this_02;
            rect.x1.m_i = auStack_e0._0_4_;
            rect.y1.m_i = auStack_e0._4_4_;
            auVar2 = local_e8;
            _local_e8 = QVar3;
            _local_e8 = QDockAreaLayout::constrainedRect((QDockAreaLayout *)auVar2,rect,pQVar11);
            local_108.d = local_e8;
            QWidget::move(&this_02->super_QWidget,(QPoint *)&local_108);
            local_108.d = (Data *)CONCAT44((auStack_e0._4_4_ - local_e8._4_4_) + 1,
                                           (auStack_e0._0_4_ - local_e8._0_4_) + 1);
            QWidget::resize(&this_02->super_QWidget,(QSize *)&local_108);
            bVar9 = QDockAreaLayoutInfo::onlyHasPlaceholders((QDockAreaLayoutInfo *)this_04);
            if (bVar9) {
              QDockAreaLayoutInfo::reparentWidgets
                        ((QDockAreaLayoutInfo *)this_04,&this_02->super_QWidget);
            }
            else {
              QWidget::show(&this_02->super_QWidget);
            }
            if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,8,0x10);
              }
            }
            if (bVar8) goto LAB_0043a379;
          }
          else if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            iVar1 = ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            auVar2 = (undefined1  [8])local_148.d.d;
joined_r0x0043a3a3:
            if (iVar1 == 0) {
              QArrayData::deallocate((QArrayData *)auVar2,8,0x10);
            }
          }
        default:
          goto switchD_00439dd3_caseD_fa;
        case 0xfc:
        case 0xfe:
          local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
          auStack_e0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          findChildrenHelper<QToolBar*>((QList<QToolBar_*> *)local_e8,(QObject *)this->mainWindow);
          bVar8 = QToolBarAreaLayout::restoreState
                            (&this->toolBarAreaLayout,(QDataStream *)&local_78,
                             (QList<QToolBar_*> *)local_e8,local_129,false);
          if (!bVar8) {
LAB_0043a393:
            if (local_e8 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
              iVar1 = (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i;
              UNLOCK();
              auVar2 = local_e8;
              goto joined_r0x0043a3a3;
            }
            goto switchD_00439dd3_caseD_fa;
          }
          if (local_d8 != (QWidget **)0x0) {
            ppQVar12 = (QWidget **)0x0;
            do {
              pQVar11 = *(QWidget **)(&((QArrayData *)auStack_e0)->ref_ + (long)ppQVar12 * 2);
              local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_108.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
              QToolBarAreaLayout::indexOf((QList<int> *)&local_108,&this->toolBarAreaLayout,pQVar11)
              ;
              if ((undefined1 *)local_108.size == (undefined1 *)0x0) {
                local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_148.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
                QToolBarAreaLayout::indexOf
                          ((QList<int> *)&local_148,&oldState->toolBarAreaLayout,pQVar11);
                if ((undefined1 *)local_148.d.size != (undefined1 *)0x0) {
                  QToolBarAreaLayoutInfo::insertToolBar
                            ((this->toolBarAreaLayout).docks + *(int *)local_148.d.ptr,
                             (QToolBar *)0x0,(QToolBar *)pQVar11);
                }
                if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,4,0x10);
                  }
                }
              }
              if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_108.d)->super_QArrayData,4,0x10);
                }
              }
              ppQVar12 = (QWidget **)((long)ppQVar12 + 1);
            } while (ppQVar12 < local_d8);
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,8,0x10);
            }
          }
          break;
        case 0xfd:
          local_d8 = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
          auStack_e0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          allMyDockWidgets((QList<QDockWidget_*> *)local_e8,&this->mainWindow->super_QWidget);
          bVar8 = QDockAreaLayout::restoreState
                            (this_00,(QDataStream *)&local_78,(QList<QDockWidget_*> *)local_e8,false
                            );
          if (!bVar8) goto LAB_0043a393;
          if (local_d8 != (QWidget **)0x0) {
            ppQVar12 = (QWidget **)0x0;
            do {
              pQVar11 = *(QWidget **)(&((QArrayData *)auStack_e0)->ref_ + (long)ppQVar12 * 2);
              local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_108.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
              QDockAreaLayout::indexOf((QList<int> *)&local_108,this_00,pQVar11);
              if ((undefined1 *)local_108.size == (undefined1 *)0x0) {
                local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_148.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
                QDockAreaLayout::indexOf((QList<int> *)&local_148,&oldState->dockAreaLayout,pQVar11)
                ;
                if (((undefined1 *)local_148.d.size != (undefined1 *)0x0) &&
                   (this_03 = QDockAreaLayout::info(this_00,(QList<int> *)&local_148),
                   this_03 != (QDockAreaLayoutInfo *)0x0)) {
                  QDockAreaLayoutInfo::add(this_03,pQVar11);
                }
                if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,4,0x10);
                  }
                }
              }
              if (&(local_108.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_108.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_108.d)->super_QArrayData,4,0x10);
                }
              }
              ppQVar12 = (QWidget **)((long)ppQVar12 + 1);
            } while (ppQVar12 < local_d8);
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,8,0x10);
            }
          }
        }
        if (bVar8 == false) break;
LAB_0043a379:
        local_174 = QDataStream::atEnd();
      } while (local_174 == 0);
    }
switchD_00439dd3_caseD_fa:
    QDataStream::~QDataStream((QDataStream *)&local_78);
  }
  else {
    local_174 = 0;
  }
  QDataStream::~QDataStream((QDataStream *)&local_58);
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(local_174 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::restoreState(QDataStream &_stream,
                                        const QMainWindowLayoutState &oldState)
{
    //make a copy of the data so that we can read it more than once
    QByteArray copy;
    while(!_stream.atEnd()) {
        int length = 1024;
        QByteArray ba(length, '\0');
        length = _stream.readRawData(ba.data(), ba.size());
        ba.resize(length);
        copy += ba;
    }

    QDataStream ds(copy);
    ds.setVersion(_stream.version());
    if (!checkFormat(ds))
        return false;

    QDataStream stream(copy);
    stream.setVersion(_stream.version());

    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets))
                        return false;

                    for (int i = 0; i < dockWidgets.size(); ++i) {
                        QDockWidget *w = dockWidgets.at(i);
                        QList<int> path = dockAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.dockAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            QDockAreaLayoutInfo *info = dockAreaLayout.info(oldPath);
                            if (info == nullptr) {
                                continue;
                            }
                            info->add(w);
                        }
                    }
                }
                break;
#if QT_CONFIG(tabwidget)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
            {
                auto dockWidgets = allMyDockWidgets(mainWindow);
                QDockWidgetGroupWindow* floatingTab = qt_mainwindow_layout(mainWindow)->createTabbedDockWindow();
                *floatingTab->layoutInfo() = QDockAreaLayoutInfo(
                    &dockAreaLayout.sep, QInternal::LeftDock, // FIXME: DockWidget doesn't save original docking area
                    Qt::Horizontal, QTabBar::RoundedSouth, mainWindow);
                QRect geometry;
                stream >> geometry;
                QDockAreaLayoutInfo *info = floatingTab->layoutInfo();
                if (!info->restoreState(stream, dockWidgets, false))
                    return false;
                geometry = QDockAreaLayout::constrainedRect(geometry, floatingTab);
                floatingTab->move(geometry.topLeft());
                floatingTab->resize(geometry.size());

                // Don't show an empty QDockWidgetGroupWindow if no dock widget is available yet.
                // reparentWidgets() would be triggered by show(), so do it explicitly here.
                if (info->onlyHasPlaceholders())
                    info->reparentWidgets(floatingTab);
                else
                    floatingTab->show();
            }
            break;
#endif // QT_CONFIG(tabwidget)
#endif // QT_CONFIG(dockwidget)

#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker))
                        return false;

                    for (int i = 0; i < toolBars.size(); ++i) {
                        QToolBar *w = toolBars.at(i);
                        QList<int> path = toolBarAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.toolBarAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            toolBarAreaLayout.docks[oldPath.at(0)].insertToolBar(nullptr, w);
                        }
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)
            default:
                return false;
        }// switch
    } //while


    return true;
}